

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

void __thiscall cmExtraCodeLiteGenerator::cmExtraCodeLiteGenerator(cmExtraCodeLiteGenerator *this)

{
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator = (cmGlobalGenerator *)0x0;
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cmExternalMakefileProjectGenerator).Name._M_dataplus._M_p =
       (pointer)&(this->super_cmExternalMakefileProjectGenerator).Name.field_2;
  (this->super_cmExternalMakefileProjectGenerator).Name._M_string_length = 0;
  (this->super_cmExternalMakefileProjectGenerator).Name.field_2._M_local_buf[0] = '\0';
  (this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExtraCodeLiteGenerator_006338b0;
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->ConfigName,"NoConfig","");
  (this->WorkspacePath)._M_dataplus._M_p = (pointer)&(this->WorkspacePath).field_2;
  (this->WorkspacePath)._M_string_length = 0;
  (this->WorkspacePath).field_2._M_local_buf[0] = '\0';
  this->CpuCount = 2;
  return;
}

Assistant:

cmExtraCodeLiteGenerator::cmExtraCodeLiteGenerator()
  : ConfigName("NoConfig")
{
}